

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QPixmapStylePixmap * __thiscall
QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
          (QPixmapStylePixmap *__return_storage_ptr__,
          QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *this,ControlPixmap *key)

{
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this->d != (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *)0x0)
  {
    pNVar1 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
             findNode<QPixmapStyle::ControlPixmap>(this->d,key);
    if (pNVar1 != (Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)0x0) {
      QPixmap::QPixmap(&__return_storage_ptr__->pixmap,&(pNVar1->value).pixmap);
      iVar2 = (pNVar1->value).margins.m_left.m_i;
      iVar3 = (pNVar1->value).margins.m_top.m_i;
      iVar4 = (pNVar1->value).margins.m_right.m_i;
      iVar5 = (pNVar1->value).margins.m_bottom.m_i;
      goto LAB_00345654;
    }
  }
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = 0;
  (__return_storage_ptr__->margins).m_left = 0;
  (__return_storage_ptr__->margins).m_top = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0;
  (__return_storage_ptr__->margins).m_right = 0;
  (__return_storage_ptr__->margins).m_bottom = 0;
  QPixmap::QPixmap(&__return_storage_ptr__->pixmap);
  iVar2 = 0;
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
LAB_00345654:
  (__return_storage_ptr__->margins).m_left.m_i = iVar2;
  (__return_storage_ptr__->margins).m_top.m_i = iVar3;
  (__return_storage_ptr__->margins).m_right.m_i = iVar4;
  (__return_storage_ptr__->margins).m_bottom.m_i = iVar5;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }